

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* util::rpn_parse_v2(stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *__return_storage_ptr__,string *expr)

{
  bool bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  front_insert_iterator<std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it_00;
  char *pcVar4;
  reference pvVar5;
  undefined1 local_428 [4];
  int prec_1;
  int local_408;
  int local_3fc;
  undefined1 local_3f8 [4];
  int prev_prec;
  reference local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *prev_tok;
  _Self local_3b0;
  byte local_389;
  undefined1 local_388 [7];
  bool is_unary;
  int local_368;
  int local_35c;
  reference pbStack_358;
  int prec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tok;
  undefined1 local_330 [8];
  iterator it;
  undefined1 local_300 [8];
  Lexer lexer;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  stringstream ss;
  undefined1 local_c0 [8];
  stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> op_stack;
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stack;
  anon_class_1_0_00000001 op_prec;
  anon_class_1_0_00000001 prec_is_op;
  string *expr_local;
  
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&op_stack.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node);
  std::
  stack<util::rpn_parse_v2(std::__cxx11::string)::op_stack_t,std::deque<util::rpn_parse_v2(std::__cxx11::string)::op_stack_t,std::allocator<util::rpn_parse_v2(std::__cxx11::string)::op_stack_t>>>
  ::
  stack<std::deque<util::rpn_parse_v2(std::__cxx11::string)::op_stack_t,std::allocator<util::rpn_parse_v2(std::__cxx11::string)::op_stack_t>>,void>
            ((stack<util::rpn_parse_v2(std::__cxx11::string)::op_stack_t,std::deque<util::rpn_parse_v2(std::__cxx11::string)::op_stack_t,std::allocator<util::rpn_parse_v2(std::__cxx11::string)::op_stack_t>>>
              *)local_c0);
  _Var3 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)
             &tokens.
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,(string *)expr,_Var3);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&lexer.token_buffer.c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  Lexer::Lexer((Lexer *)local_300,
               (istream *)
               &tokens.
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node);
  it_00 = std::front_inserter<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&lexer.token_buffer.c.
                                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  it._M_node = (_Map_pointer)
               Lexer::
               Lex<std::front_insert_iterator<std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                         ((Lexer *)local_300,it_00);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::begin((iterator *)local_330,
          (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&lexer.token_buffer.c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
  do {
    std::
    deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::end((iterator *)&tok,
          (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)((long)&lexer.token_buffer.c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish + 0x18));
    bVar1 = std::operator!=((_Self *)local_330,(_Self *)&tok);
    if (!bVar1) {
      while (bVar1 = std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::
                     empty((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>
                            *)local_c0), ((bVar1 ^ 0xffU) & 1) != 0) {
        pvVar5 = std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::top
                           ((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>
                             *)local_c0);
        bVar1 = rpn_parse_v2::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)
                           ((long)&stack.
                                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Deque_impl_data._M_finish._M_node + 7),
                           pvVar5->prec);
        if (bVar1) {
          pvVar5 = std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::top
                             ((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>
                               *)local_c0);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&op_stack.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                           _M_impl.super__Deque_impl_data._M_finish._M_node,&pvVar5->tok);
        }
        std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                  ((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> *)
                   local_c0);
      }
      std::
      stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::stack(__return_storage_ptr__,
              (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&op_stack.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node);
      Lexer::~Lexer((Lexer *)local_300);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&lexer.token_buffer.c.
                          super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish + 0x18));
      std::__cxx11::stringstream::~stringstream
                ((stringstream *)
                 &tokens.
                  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node);
      std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::~stack
                ((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> *)local_c0
                );
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&op_stack.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node);
      return __return_storage_ptr__;
    }
    pbStack_358 = std::
                  _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  ::operator*((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                               *)local_330);
    rpn_map_multichar_op(pbStack_358);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pbStack_358);
    local_35c = rpn_parse_v2::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)
                           ((long)&stack.
                                   super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Deque_impl_data._M_finish._M_node + 6),*pcVar4);
    if (local_35c == 0) {
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&op_stack.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>._M_impl
                       .super__Deque_impl_data._M_finish._M_node,pbStack_358);
    }
    else if ((local_35c == 99) &&
            (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pbStack_358), *pcVar4 == ')'))
    {
      std::__cxx11::string::string((string *)local_388,(string *)pbStack_358);
      local_368 = local_35c;
      std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::push
                ((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> *)local_c0
                 ,(value_type *)local_388);
      rpn_parse_v2::op_stack_t::~op_stack_t((op_stack_t *)local_388);
    }
    else {
      bVar1 = rpn_parse_v2::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)
                         ((long)&stack.
                                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_node + 7),local_35c);
      if (bVar1) {
        local_389 = 0;
        std::operator+(&local_3b0,(_Self *)local_330,1);
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((iterator *)&prev_tok,
              (deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&lexer.token_buffer.c.
                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish + 0x18));
        bVar1 = std::operator==(&local_3b0,(_Self *)&prev_tok);
        if (bVar1) {
          local_389 = 1;
        }
        else {
          std::operator+((_Self *)local_3f8,(_Self *)local_330,1);
          local_3d8 = std::
                      _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                      ::operator*((_Self *)local_3f8);
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_3d8);
          local_3fc = rpn_parse_v2::anon_class_1_0_00000001::operator()
                                ((anon_class_1_0_00000001 *)
                                 ((long)&stack.
                                         super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Deque_impl_data._M_finish._M_node + 6),
                                 *pcVar4);
          if ((local_3fc != 0) && (bVar1 = std::operator!=(local_3d8,")"), bVar1)) {
            local_389 = 1;
          }
        }
        if ((local_389 & 1) == 0) {
          while( true ) {
            bVar2 = std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::
                    empty((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> *
                          )local_c0);
            bVar1 = false;
            if (!bVar2) {
              pvVar5 = std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>
                       ::top((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>
                              *)local_c0);
              bVar1 = pvVar5->prec < local_35c;
            }
            if (!bVar1) break;
            pvVar5 = std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::
                     top((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> *)
                         local_c0);
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&op_stack.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                             _M_impl.super__Deque_impl_data._M_finish._M_node,&pvVar5->tok);
            std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                      ((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> *)
                       local_c0);
          }
        }
        else {
          local_35c = 1;
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pbStack_358);
          if (*pcVar4 == '-') {
            std::__cxx11::string::operator=((string *)pbStack_358,'\a');
          }
          while( true ) {
            bVar2 = std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::
                    empty((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> *
                          )local_c0);
            bVar1 = false;
            if (!bVar2) {
              pvVar5 = std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>
                       ::top((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>
                              *)local_c0);
              bVar1 = pvVar5->prec <= local_35c;
            }
            if (!bVar1) break;
            pvVar5 = std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::
                     top((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> *)
                         local_c0);
            std::
            deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&op_stack.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                             _M_impl.super__Deque_impl_data._M_finish._M_node,&pvVar5->tok);
            std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                      ((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> *)
                       local_c0);
          }
        }
      }
      else if (local_35c == 0x62) {
        while( true ) {
          bVar2 = std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::
                  empty((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> *)
                        local_c0);
          bVar1 = false;
          if (!bVar2) {
            pvVar5 = std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::
                     top((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> *)
                         local_c0);
            bVar1 = pvVar5->prec <= local_35c;
          }
          if (!bVar1) break;
          pvVar5 = std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::top
                             ((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>
                               *)local_c0);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&op_stack.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                           _M_impl.super__Deque_impl_data._M_finish._M_node,&pvVar5->tok);
          std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                    ((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> *)
                     local_c0);
        }
      }
      else if (local_35c == 99) {
        while (bVar1 = std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>
                       ::empty((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>
                                *)local_c0), ((bVar1 ^ 0xffU) & 1) != 0) {
          pvVar5 = std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::top
                             ((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>
                               *)local_c0);
          if (pvVar5->prec == 99) {
            std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                      ((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> *)
                       local_c0);
            break;
          }
          pvVar5 = std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::top
                             ((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>
                               *)local_c0);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&op_stack.c.super__Deque_base<op_stack_t,_std::allocator<op_stack_t>_>.
                           _M_impl.super__Deque_impl_data._M_finish._M_node,&pvVar5->tok);
          std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::pop
                    ((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> *)
                     local_c0);
        }
      }
      bVar1 = rpn_parse_v2::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)
                         ((long)&stack.
                                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_node + 7),local_35c);
      if (bVar1) {
        std::__cxx11::string::string((string *)local_428,(string *)pbStack_358);
        local_408 = local_35c;
        std::stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_>::push
                  ((stack<op_stack_t,_std::deque<op_stack_t,_std::allocator<op_stack_t>_>_> *)
                   local_c0,(value_type *)local_428);
        rpn_parse_v2::op_stack_t::~op_stack_t((op_stack_t *)local_428);
      }
    }
    std::
    _Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
    ::operator++((_Deque_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                  *)local_330);
  } while( true );
}

Assistant:

std::stack<std::string> rpn_parse_v2(std::string expr)
{
	static const int prec_value = 0;
	static const int prec_unary = 1;
	static const int prec_comma = 98;
	static const int prec_paren = 99;

	auto prec_is_op = [](int prec) { return prec > 0 && prec < 98; };

	auto op_prec = [](char c)
	{
		switch (c)
		{
			case '!': case '~':
				return 2;
			case '*': case '/': case '%':
				return 3;
			case '+': case '-':
				return 4;
			case '<': case op_lte: case '>': case op_gte:
				return 5;
			case '=': case op_ne:
				return 6;
			case '^':
				return 7;
			case '|':
				return 8;
			case '&':
				return 9;
			case op_and:
				return 10;
			case op_or:
				return 11;
			case ',':
				return prec_comma;
			case '(': case ')':
				return prec_paren;
		}

		return prec_value;
	};

	// The result is built up in reverse order
	std::deque<std::string> stack;
	struct op_stack_t { std::string tok; int prec; };
	std::stack<op_stack_t> op_stack;

	std::stringstream ss(expr);
	std::deque<std::string> tokens;
	Lexer lexer(ss);
	lexer.Lex(std::front_inserter(tokens));

	for (auto it = tokens.begin(); it != tokens.end(); ++it)
	{
		auto& tok = *it;
		rpn_map_multichar_op(tok);
		int prec = op_prec(tok[0]);

		if (prec == prec_value)
		{
			stack.push_front(tok);
			continue;
		}

		if (prec == prec_paren && tok[0] == ')')
		{
			op_stack.push({tok, prec});
			continue;
		}

		if (prec_is_op(prec))
		{
			bool is_unary = false;

			if ((it + 1) == tokens.end())
			{
				is_unary = true;
			}
			else
			{
				auto& prev_tok = *(it + 1);
				int prev_prec = op_prec(prev_tok[0]);

				if (prev_prec != 0 && prev_tok != ")")
					is_unary = true;
			}

			if (is_unary)
			{
				prec = prec_unary;

				if (tok[0] == '-')
					tok = op_neg;

				while (!op_stack.empty() && (op_stack.top().prec <= prec))
				{
					stack.push_front(op_stack.top().tok);
					op_stack.pop();
				}
			}
			else
			{
				while (!op_stack.empty() && (op_stack.top().prec < prec))
				{
					stack.push_front(op_stack.top().tok);
					op_stack.pop();
				}
			}
		}
		else if (prec == prec_comma)
		{
			while (!op_stack.empty() && (op_stack.top().prec <= prec))
			{
				stack.push_front(op_stack.top().tok);
				op_stack.pop();
			}
		}
		else if (prec == prec_paren)
		{
			while (!op_stack.empty())
			{
				if (op_stack.top().prec == prec_paren)
				{
					op_stack.pop();
					break;
				}

				stack.push_front(op_stack.top().tok);
				op_stack.pop();
			}
		}

		if (prec_is_op(prec))
			op_stack.push({tok, prec});
	}

	for (; !op_stack.empty(); op_stack.pop())
	{
		int prec = op_stack.top().prec;
		if (prec_is_op(prec))
			stack.push_front(op_stack.top().tok);
	}

	return std::stack<std::string>(std::move(stack));
}